

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  string *__ptr;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_428;
  undefined1 local_408 [8];
  glyph g;
  char **argv_local;
  int argc_local;
  
  g._1000_8_ = argv;
  if (argc != 3) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"usage: ");
    poVar1 = std::operator<<(poVar1,*(char **)g._1000_8_);
    std::operator<<(poVar1," file.ttf 0x0042\n");
    exit(1);
  }
  font2svg::glyph::glyph((glyph *)local_408,argv[1],argv[2]);
  font2svg::glyph::svgheader_abi_cxx11_(&local_428,(glyph *)local_408);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_428);
  font2svg::glyph::svgborder_abi_cxx11_(&local_458,(glyph *)local_408);
  poVar1 = std::operator<<(poVar1,(string *)&local_458);
  font2svg::glyph::svgtransform_abi_cxx11_(&local_478,(glyph *)local_408);
  poVar1 = std::operator<<(poVar1,(string *)&local_478);
  font2svg::glyph::axes_abi_cxx11_(&local_498,(glyph *)local_408);
  poVar1 = std::operator<<(poVar1,(string *)&local_498);
  font2svg::glyph::typography_box_abi_cxx11_(&local_4b8,(glyph *)local_408);
  poVar1 = std::operator<<(poVar1,(string *)&local_4b8);
  font2svg::glyph::points_abi_cxx11_(&local_4d8,(glyph *)local_408);
  poVar1 = std::operator<<(poVar1,(string *)&local_4d8);
  font2svg::glyph::pointlines_abi_cxx11_(&local_4f8,(glyph *)local_408);
  poVar1 = std::operator<<(poVar1,(string *)&local_4f8);
  font2svg::glyph::outline_abi_cxx11_(&local_518,(glyph *)local_408);
  poVar1 = std::operator<<(poVar1,(string *)&local_518);
  font2svg::glyph::labelpts_abi_cxx11_(&local_538,(glyph *)local_408);
  poVar1 = std::operator<<(poVar1,(string *)&local_538);
  font2svg::glyph::svgfooter_abi_cxx11_(&local_558,(glyph *)local_408);
  __ptr = &local_558;
  std::operator<<(poVar1,(string *)__ptr);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_428);
  font2svg::glyph::free((glyph *)local_408,__ptr);
  font2svg::glyph::~glyph((glyph *)local_408);
  return 0;
}

Assistant:

int main( int argc, char * argv[] )
{
	if (argc!=3) {
		std::cerr << "usage: " << argv[0] << " file.ttf 0x0042\n";
		exit( 1 );
	}

	font2svg::glyph g( argv[1], argv[2] );
	std::cout << g.svgheader()
		<< g.svgborder()
		<< g.svgtransform()
		<< g.axes()
		<< g.typography_box()
		<< g.points()
		<< g.pointlines()
		<< g.outline()
		<< g.labelpts()
		<< g.svgfooter();

	g.free();

  return 0;
}